

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.cc
# Opt level: O1

Metric * __thiscall Metrics::NewMetric(Metrics *this,string *name)

{
  iterator __position;
  Metric *metric;
  Metric *local_20;
  
  local_20 = (Metric *)operator_new(0x30);
  (local_20->name)._M_dataplus._M_p = (pointer)&(local_20->name).field_2;
  (local_20->name)._M_string_length = 0;
  (local_20->name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)local_20);
  local_20->count = 0;
  local_20->sum = 0;
  __position._M_current = *(Metric ***)&this->field_0x8;
  if (__position._M_current == *(Metric ***)&this->field_0x10) {
    std::vector<Metric*,std::allocator<Metric*>>::_M_realloc_insert<Metric*const&>
              ((vector<Metric*,std::allocator<Metric*>> *)this,__position,&local_20);
  }
  else {
    *__position._M_current = local_20;
    *(long *)&this->field_0x8 = *(long *)&this->field_0x8 + 8;
  }
  return local_20;
}

Assistant:

Metric* Metrics::NewMetric(const string& name) {
  Metric* metric = new Metric;
  metric->name = name;
  metric->count = 0;
  metric->sum = 0;
  metrics_.push_back(metric);
  return metric;
}